

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O2

tuple<char_*,_unsigned_long> __thiscall
bubbleJson::BubbleJson::Stringify
          (BubbleJson *this,BubbleValue *bubbleValue,StringifyTypes stringifyType)

{
  char *pcVar1;
  size_t sVar2;
  _Head_base<0UL,_char_*,_false> _Var3;
  StringifyTypes in_ECX;
  undefined4 in_register_00000014;
  tuple<char_*,_unsigned_long> tVar4;
  
  MemoryFreeContextStack((BubbleJson *)bubbleValue);
  StringifyValue((BubbleJson *)bubbleValue,
                 (BubbleValue *)CONCAT44(in_register_00000014,stringifyType),in_ECX,0);
  pcVar1 = (bubbleValue->u).string.literal;
  sVar2 = *(size_t *)(pcVar1 + 8);
  _Var3._M_head_impl = pcVar1[0x18];
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  this->context = (BubbleContext *)_Var3._M_head_impl;
  this->stackInitSize = sVar2;
  tVar4.super__Tuple_impl<0UL,_char_*,_unsigned_long>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = _Var3._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_char_*,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<char_*,_unsigned_long>)tVar4.super__Tuple_impl<0UL,_char_*,_unsigned_long>;
}

Assistant:

std::tuple<char*, size_t > BubbleJson::Stringify(BubbleValue *bubbleValue, StringifyTypes stringifyType)
{
    MemoryFreeContextStack();
    StringifyValue(bubbleValue, stringifyType, 0);
    char* json = this->context->stack;
    size_t length = this->context->top;

    //clear memory mark,but not memory space
    //ownership is transferred to return value
    this->context->top = 0;
    this->context->size = 0;
    this->context->stack = nullptr;
    return make_tuple(json, length);
}